

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void fullinc(lua_State *L,global_State *g)

{
  GCObject **p;
  GCObject **old;
  global_State *pgVar1;
  
  if (g->gcstate < 3) {
    pgVar1 = L->l_G;
    pgVar1->gcstate = '\x03';
    p = &pgVar1->allgc;
    do {
      p = sweeplist(L,p,1);
    } while (p == &pgVar1->allgc);
    pgVar1->sweepgc = p;
  }
  pgVar1 = L->l_G;
  if (pgVar1->gcstate != '\b') {
    do {
      singlestep(L,1);
    } while (pgVar1->gcstate != '\b');
    pgVar1 = L->l_G;
    if (pgVar1->gcstate == '\a') goto LAB_0010ea9e;
  }
  do {
    singlestep(L,1);
  } while (pgVar1->gcstate != '\a');
  pgVar1 = L->l_G;
  while (pgVar1->gcstate != '\b') {
LAB_0010ea9e:
    singlestep(L,1);
  }
  setpause(g);
  return;
}

Assistant:

static void fullinc (lua_State *L, global_State *g) {
  if (keepinvariant(g))  /* black objects? */
    entersweep(L); /* sweep everything to turn them back to white */
  /* finish any pending sweep phase to start a new cycle */
  luaC_runtilstate(L, GCSpause, 1);
  luaC_runtilstate(L, GCScallfin, 1);  /* run up to finalizers */
  luaC_runtilstate(L, GCSpause, 1);  /* finish collection */
  setpause(g);
}